

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O1

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QObject *this_00;
  uint uVar1;
  int iVar2;
  QObject *model;
  int last;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  if (((parent->r < 0) || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)) {
    model = QObject::sender(this_00);
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    uVar1 = (*model->_vptr_QObject[0x10])(model);
    iVar2 = columnCountAfterChange(this,(QAbstractItemModel *)model,(end - start) + uVar1 + 1);
    if ((int)uVar1 < iVar2) {
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      last = ~uVar1 + start + iVar2;
      if (end <= last) {
        last = end;
      }
      QAbstractItemModel::beginInsertColumns((QAbstractItemModel *)this_00,&local_50,start,last);
    }
    this->m_newColumnCount = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted(const QModelIndex &parent,
                                                                       int start, int end)
{
    Q_Q(QConcatenateTablesProxyModel);
    if (parent.isValid()) // flat model
        return;
    const QAbstractItemModel * const model = static_cast<QAbstractItemModel *>(q->sender());
    const int oldColCount = model->columnCount();
    const int newColCount = columnCountAfterChange(model, oldColCount + end - start + 1);
    Q_ASSERT(newColCount >= oldColCount);
    if (newColCount > oldColCount)
        // If the underlying models have a different number of columns (example: 2 and 3), inserting 2 columns in
        // the first model leads to inserting only one column in the proxy, since qMin(2+2,3) == 3.
        q->beginInsertColumns(QModelIndex(), start, qMin(end, start + newColCount - oldColCount - 1));
    m_newColumnCount = newColCount;
}